

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

CuePoint * __thiscall mkvparser::Cues::GetLast(Cues *this)

{
  longlong lVar1;
  CuePoint *pCP;
  CuePoint **pp;
  long index;
  Cues *this_local;
  
  if ((this->m_cue_points == (CuePoint **)0x0) || (this->m_count < 1)) {
    this_local = (Cues *)0x0;
  }
  else if (this->m_cue_points == (CuePoint **)0x0) {
    this_local = (Cues *)0x0;
  }
  else {
    this_local = (Cues *)this->m_cue_points[this->m_count + -1];
    if ((this_local == (Cues *)0x0) ||
       (lVar1 = CuePoint::GetTimeCode((CuePoint *)this_local), lVar1 < 0)) {
      this_local = (Cues *)0x0;
    }
  }
  return (CuePoint *)this_local;
}

Assistant:

const CuePoint* Cues::GetLast() const {
  if (m_cue_points == NULL || m_count <= 0)
    return NULL;

  const long index = m_count - 1;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL)
    return NULL;

  CuePoint* const pCP = pp[index];
  if (pCP == NULL || pCP->GetTimeCode() < 0)
    return NULL;

  return pCP;
}